

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Statement.cpp
# Opt level: O3

int __thiscall SQLite::Statement::bind(Statement *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  int iVar1;
  Exception *this_00;
  undefined4 in_register_00000034;
  
  iVar1 = sqlite3_bind_parameter_index
                    ((this->mStmtPtr).mpStmt,(char *)CONCAT44(in_register_00000034,__fd));
  iVar1 = sqlite3_bind_blob((this->mStmtPtr).mpStmt,iVar1,__addr,__len,
                            (_func_void_void_ptr *)0xffffffffffffffff);
  if (iVar1 == 0) {
    return 0x260510;
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x18);
  Exception::Exception(this_00,(this->mStmtPtr).mpSQLite,iVar1);
  __cxa_throw(this_00,&Exception::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void Statement::bind(const char* apName, const void* apValue, const int aSize)
{
    const int index = sqlite3_bind_parameter_index(mStmtPtr, apName);
    const int ret = sqlite3_bind_blob(mStmtPtr, index, apValue, aSize, SQLITE_TRANSIENT);
    check(ret);
}